

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O1

void __thiscall
TransactionContext_AddTxInOut_Test::TestBody(TransactionContext_AddTxInOut_Test *this)

{
  pointer *ppuVar1;
  pointer pcVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar__3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t index;
  AssertionResult gtest_ar;
  OutPoint outpoint;
  Address out1_addr;
  TransactionContext txc;
  Script locking_script;
  Address script_addr;
  Address addr;
  AssertHelper local_620;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_618;
  AssertHelper local_610;
  string local_608;
  uint32_t local_5e4;
  Script local_5e0;
  AssertHelper local_5a8;
  OutPoint local_5a0;
  undefined1 local_578 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  uchar local_558 [16];
  pointer local_548;
  pointer local_530;
  pointer local_518;
  TapBranch local_500;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_488;
  Script local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_430;
  TransactionContext local_400;
  Script local_348;
  undefined1 local_310 [32];
  undefined1 local_2f0 [16];
  pointer local_2e0;
  pointer local_2c8;
  pointer local_2b0;
  TapBranch local_298;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_220;
  Script local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  Address local_198;
  
  cfd::TransactionContext::TransactionContext(&local_400,2,0);
  pcVar2 = local_310 + 0x10;
  local_310._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn","");
  cfd::core::Address::Address(&local_198,(string *)local_310);
  if ((pointer)local_310._0_8_ != pcVar2) {
    operator_delete((void *)local_310._0_8_);
  }
  local_310._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c","");
  cfd::core::Script::Script(&local_348,(string *)local_310);
  if ((pointer)local_310._0_8_ != pcVar2) {
    operator_delete((void *)local_310._0_8_);
  }
  cfd::core::Address::Address((Address *)local_310,kCfdSuccess,&local_348);
  ppuVar1 = (pointer *)
            ((long)&local_5e0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_5e0._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e0,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_578,(string *)&local_5e0);
  cfd::core::OutPoint::OutPoint(&local_5a0,(Txid *)local_578,2);
  local_578._0_8_ = &PTR__Txid_00735400;
  if ((pointer)local_578._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_578._8_8_);
  }
  if (local_5e0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_5e0._vptr_Script);
  }
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_608,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)&local_5e0,&local_608);
  cfd::core::OutPoint::OutPoint((OutPoint *)local_578,(Txid *)&local_5e0,0);
  cfd::TransactionContext::AddTxIn(&local_400,(OutPoint *)local_578);
  local_578._0_8_ = &PTR__Txid_00735400;
  if ((pointer)local_578._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_578._8_8_);
  }
  local_5e0._vptr_Script = (_func_int **)&PTR__Txid_00735400;
  if (local_5e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  cfd::TransactionContext::AddTxIn(&local_400,&local_5a0);
  cfd::core::Amount::Amount((Amount *)local_578,100000000000000);
  cfd::TransactionContext::AddTxOut(&local_400,(Address *)local_310,(Amount *)local_578);
  cfd::core::Amount::Amount((Amount *)local_578,0x640b2351f97c);
  cfd::TransactionContext::AddTxOut(&local_400,&local_198,(Amount *)local_578);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_578,(AbstractTransaction *)&local_400);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5e0,"txc.GetHex().c_str()",
             "\"0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000\""
             ,(char *)local_578._0_8_,
             "0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._0_8_ != &local_568) {
    operator_delete((void *)local_578._0_8_);
  }
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_578);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x59,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_608,(Message *)local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_608);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_578._0_8_ + 8))();
      }
      local_578._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_578,&local_198);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5e0,"addr.GetAddress().c_str()",
             "\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",(char *)local_578._0_8_,
             "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._0_8_ != &local_568) {
    operator_delete((void *)local_578._0_8_);
  }
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_578);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x5a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_608,(Message *)local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_608);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_578._0_8_ + 8))();
      }
      local_578._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::TransactionContext::GetTxOutAddress((Address *)local_578,&local_400,1,kMainnet);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_5e0,(Address *)local_578);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_608,"out1_addr.GetAddress().c_str()",
             "\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",(char *)local_5e0._vptr_Script,
             "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  if (local_5e0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_5e0._vptr_Script);
  }
  if ((char)local_608._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5e0);
    if ((undefined8 *)local_608._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_608._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_620,(Message *)&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    if (local_5e0._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_5e0._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_5e0._vptr_Script + 8))();
      }
      local_5e0._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_608._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5e4 = 0;
  bVar3 = cfd::TransactionContext::IsFindTxIn(&local_400,&local_5a0,&local_5e4);
  local_608._M_dataplus._M_p._0_1_ = bVar3;
  local_608._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_620);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5e0,(internal *)&local_608,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x60,(char *)local_5e0._vptr_Script);
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    if (local_5e0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5e0._vptr_Script);
    }
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_608._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_608._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5e0,"index","1",&local_5e4,(int *)&local_608);
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_608);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x61,pcVar5);
    testing::internal::AssertHelper::operator=(&local_620,(Message *)&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    if ((long *)local_608._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_608._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_608._M_dataplus._M_p + 8))();
      }
      local_608._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::TransactionContext::IsFindTxOut
                    (&local_400,&local_198,&local_5e4,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_608._M_dataplus._M_p._0_1_ = bVar3;
  local_608._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_620);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5e0,(internal *)&local_608,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x62,(char *)local_5e0._vptr_Script);
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    if (local_5e0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5e0._vptr_Script);
    }
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_608._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_608._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5e0,"index","1",&local_5e4,(int *)&local_608);
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_608);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_620,(Message *)&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    if ((long *)local_608._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_608._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_608._M_dataplus._M_p + 8))();
      }
      local_608._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetLockingScript(&local_5e0,(Address *)local_310);
  bVar3 = cfd::TransactionContext::IsFindTxOut
                    (&local_400,&local_5e0,&local_5e4,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_608._M_dataplus._M_p._0_1_ = bVar3;
  local_608._M_string_length = 0;
  cfd::core::Script::~Script(&local_5e0);
  if ((char)local_608._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_620);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5e0,(internal *)&local_608,
               (AssertionResult *)"txc.IsFindTxOut(script_addr.GetLockingScript(), &index)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,100,(char *)local_5e0._vptr_Script);
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    if (local_5e0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5e0._vptr_Script);
    }
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_608._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_608._M_dataplus._M_p = local_608._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5e0,"index","0",&local_5e4,(int *)&local_608);
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_608);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x65,pcVar5);
    testing::internal::AssertHelper::operator=(&local_620,(Message *)&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    if ((long *)local_608._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_608._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_608._M_dataplus._M_p + 8))();
      }
      local_608._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::TransactionContext::GetTxOutIndex(&local_400,&local_198);
  local_608._M_dataplus._M_p._0_4_ = uVar4;
  local_620.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5e0,"txc.GetTxOutIndex(addr)","1",(uint *)&local_608,
             (int *)&local_620);
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_608);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=(&local_620,(Message *)&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    if ((long *)local_608._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_608._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_608._M_dataplus._M_p + 8))();
      }
      local_608._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Amount::Amount((Amount *)&local_5e0,100000000000000);
  cfd::TransactionContext::AddTxOut(&local_400,(Address *)local_310,(Amount *)&local_5e0);
  cfd::core::Amount::Amount((Amount *)&local_5e0,0x640b2351f97c);
  cfd::TransactionContext::AddTxOut(&local_400,&local_198,(Amount *)&local_5e0);
  cfd::core::Amount::Amount((Amount *)&local_5e0,100000000000000);
  cfd::TransactionContext::AddTxOut(&local_400,(Address *)local_310,(Amount *)&local_5e0);
  local_608._M_dataplus._M_p = (pointer)0x0;
  local_608._M_string_length = 0;
  local_608.field_2._M_allocated_capacity = 0;
  bVar3 = cfd::TransactionContext::IsFindTxOut
                    (&local_400,(Address *)local_310,&local_5e4,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_608);
  local_620.data_._0_1_ = bVar3;
  local_618.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_610);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5e0,(internal *)&local_620,
               (AssertionResult *)"txc.IsFindTxOut(script_addr, &index, &indexes)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6c,(char *)local_5e0._vptr_Script);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if (local_5e0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5e0._vptr_Script);
    }
    if (local_610.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_610.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_610.data_ + 8))();
      }
      local_610.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_620.data_ = local_620.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5e0,"index","0",&local_5e4,(int *)&local_620);
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_620);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_620.data_ =
       (AssertHelperData *)
       ((long)(local_608._M_string_length - (long)local_608._M_dataplus._M_p) >> 2);
  local_610.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_5e0,"indexes.size()","3",(unsigned_long *)&local_620,
             (int *)&local_610);
  if ((char)local_5e0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_620);
    if (local_5e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_5e0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5e0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_608._M_string_length - (long)local_608._M_dataplus._M_p == 0xc) {
    local_620.data_ = local_620.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_5e0,"indexes[0]","0",(uint *)local_608._M_dataplus._M_p,
               (int *)&local_620);
    if ((char)local_5e0._vptr_Script == '\0') {
      testing::Message::Message((Message *)&local_620);
      if (local_5e0.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_5e0.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_610,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x70,pcVar5);
      testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
      testing::internal::AssertHelper::~AssertHelper(&local_610);
      if (local_620.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_620.data_ + 8))();
        }
        local_620.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_5e0.script_data_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_620.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_5e0,"indexes[1]","2",(uint *)(local_608._M_dataplus._M_p + 4),
               (int *)&local_620);
    if ((char)local_5e0._vptr_Script == '\0') {
      testing::Message::Message((Message *)&local_620);
      if (local_5e0.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_5e0.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_610,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x71,pcVar5);
      testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
      testing::internal::AssertHelper::~AssertHelper(&local_610);
      if (local_620.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_620.data_ + 8))();
        }
        local_620.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_5e0.script_data_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_620.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_5e0,"indexes[2]","4",(uint *)(local_608._M_dataplus._M_p + 8),
               (int *)&local_620);
    if ((char)local_5e0._vptr_Script == '\0') {
      testing::Message::Message((Message *)&local_620);
      if (local_5e0.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_5e0.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_610,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x72,pcVar5);
      testing::internal::AssertHelper::operator=(&local_610,(Message *)&local_620);
      testing::internal::AssertHelper::~AssertHelper(&local_610);
      if (local_620.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_620.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_620.data_ + 8))();
        }
        local_620.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_5e0.script_data_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((uint *)local_608._M_dataplus._M_p != (uint *)0x0) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_430);
  cfd::core::Script::~Script(&local_470);
  local_500._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_488);
  cfd::core::TapBranch::~TapBranch(&local_500);
  if (local_518 != (pointer)0x0) {
    operator_delete(local_518);
  }
  if (local_530 != (pointer)0x0) {
    operator_delete(local_530);
  }
  if (local_548 != (pointer)0x0) {
    operator_delete(local_548);
  }
  if ((uchar *)local_568._M_allocated_capacity != local_558) {
    operator_delete((void *)local_568._M_allocated_capacity);
  }
  local_5a0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_5a0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8);
  cfd::core::Script::~Script(&local_208);
  local_298._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_220);
  cfd::core::TapBranch::~TapBranch(&local_298);
  if (local_2b0 != (pointer)0x0) {
    operator_delete(local_2b0);
  }
  if (local_2c8 != (pointer)0x0) {
    operator_delete(local_2c8);
  }
  if (local_2e0 != (pointer)0x0) {
    operator_delete(local_2e0);
  }
  if ((undefined1 *)local_310._16_8_ != local_2f0) {
    operator_delete((void *)local_310._16_8_);
  }
  cfd::core::Script::~Script(&local_348);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_198.format_data_);
  cfd::core::Script::~Script(&local_198.redeem_script_);
  local_198.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_198.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_198.script_tree_.super_TapBranch);
  if (local_198.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.address_._M_dataplus._M_p != &local_198.address_.field_2) {
    operator_delete(local_198.address_._M_dataplus._M_p);
  }
  cfd::TransactionContext::~TransactionContext(&local_400);
  return;
}

Assistant:

TEST(TransactionContext, AddTxInOut)
{
  TransactionContext txc(2, 0);
  Address addr("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  Script locking_script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  Address script_addr(NetType::kMainnet, locking_script);
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  txc.AddTxOut(addr, Amount(int64_t{109998999992700}));

  EXPECT_STREQ(txc.GetHex().c_str(), "0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kMainnet);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(script_addr.GetLockingScript(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);

  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  txc.AddTxOut(addr, Amount(int64_t{109998999992700}));
  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(script_addr, &index, &indexes));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(indexes.size(), 3);
  if (indexes.size() == 3) {
    EXPECT_EQ(indexes[0], 0);
    EXPECT_EQ(indexes[1], 2);
    EXPECT_EQ(indexes[2], 4);
  }
}